

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisualizerBuffer.cpp
# Opt level: O2

ssize_t __thiscall VisualizerBuffer::write(VisualizerBuffer *this,int __fd,void *__buf,size_t __n)

{
  void *pvVar1;
  void *pvVar2;
  ulong uVar3;
  unsigned_long __n2;
  undefined4 in_register_00000034;
  _Head_base<0UL,_float_*,_false> __dest;
  ulong uVar4;
  void *pvVar5;
  
  pvVar5 = (void *)this->mIgnoreCounter;
  pvVar1 = __buf;
  if (pvVar5 < __buf) {
    pvVar1 = pvVar5;
  }
  this->mIgnoreCounter = (long)pvVar5 - (long)pvVar1;
  if (pvVar5 < __buf) {
    uVar3 = (long)__buf - (long)pvVar1;
    pvVar5 = (void *)(CONCAT44(in_register_00000034,__fd) + (long)pvVar1 * 8);
    pvVar1 = (void *)this->mBufferSize;
    pvVar2 = (void *)this->mIndex;
    __dest._M_head_impl =
         (this->mBufferData)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
         super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
         super__Head_base<0UL,_float_*,_false>._M_head_impl + (long)pvVar2 * 2;
    do {
      uVar4 = (long)pvVar1 - (long)pvVar2;
      if (uVar3 < (ulong)((long)pvVar1 - (long)pvVar2)) {
        uVar4 = uVar3;
      }
      if ((uVar4 & 0x7fffffffffffffff) != 0) {
        memmove(__dest._M_head_impl,pvVar5,uVar4 * 8);
        pvVar1 = (void *)this->mBufferSize;
        pvVar2 = (void *)this->mIndex;
      }
      pvVar2 = (void *)((long)pvVar2 + uVar4);
      this->mIndex = (size_t)pvVar2;
      if (pvVar2 == pvVar1) {
        this->mIndex = 0;
        __dest._M_head_impl =
             (this->mBufferData)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
             _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
             super__Head_base<0UL,_float_*,_false>._M_head_impl;
        pvVar2 = (void *)0x0;
      }
      else {
        __dest._M_head_impl = __dest._M_head_impl + uVar4 * 2;
      }
      pvVar5 = (void *)((long)pvVar5 + uVar4 * 8);
      uVar3 = uVar3 - uVar4;
    } while (uVar3 != 0);
  }
  return (ssize_t)pvVar1;
}

Assistant:

void VisualizerBuffer::write(float buf[], size_t amount) {

    auto ignoring = std::min(mIgnoreCounter, amount);
    amount -= ignoring;
    mIgnoreCounter -= ignoring;

    if (amount) {
        // adjust buffer pointer skip whatever we ignored
        buf += ignoring * 2;

        auto dest = mBufferData.get() + (mIndex * 2);

        // this loop should only iterate two times max, if not then the amount is
        // greater than the buffer's capacity and the caller did not call
        // beginWrite first. Iterating more than twice is inefficient, since we
        // are overwriting what we just copied.
        for (;;) {
            auto const toWrite = std::min(mBufferSize - mIndex, amount);
            auto const toWriteSamples = toWrite * 2;
            std::copy_n(buf, toWriteSamples, dest);
            amount -= toWrite;
            mIndex += toWrite;

            if (mIndex == mBufferSize) {
                mIndex = 0;
                dest = mBufferData.get();
            } else {
                dest += toWriteSamples;
            }

            if (amount > 0) {
                buf += toWriteSamples;
            } else {
                break;
            }
        }

    }

}